

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_serialiserscommon.cpp
# Opt level: O3

void __thiscall
tst_SerialiserCommon::insertBranch
          (tst_SerialiserCommon *this,QAbstractItemModel *model,QModelIndex *parent,bool multiRoles,
          int subBranches)

{
  default_random_engine *__urng;
  QAbstractItemModel *pQVar1;
  result_type_conflict rVar2;
  int iVar3;
  undefined4 in_register_00000084;
  ulong uVar4;
  ulong uVar5;
  QString t;
  QString baseString;
  uniform_int_distribution<int> colorDistribution;
  QModelIndex idx;
  uniform_int_distribution<int> rowsDist;
  uniform_int_distribution<int> coulmnsDist;
  QString local_140;
  QString local_128;
  default_random_engine *local_108;
  QModelIndex *local_100;
  uint local_f8;
  int local_f4;
  param_type local_f0;
  undefined8 local_e8;
  QArrayData *local_e0;
  char16_t *local_d8;
  undefined8 local_d0;
  QArrayData *local_c8 [3];
  QArrayData *local_b0;
  char16_t *local_a8;
  QAbstractItemModel *pQStack_a0;
  QVariant local_98;
  tst_SerialiserCommon *local_78;
  QArrayData *local_70 [3];
  QArrayData *local_58 [3];
  param_type local_40;
  param_type local_38;
  
  local_e8 = CONCAT44(in_register_00000084,subBranches);
  local_f0._M_a = 0;
  local_f0._M_b = 5;
  local_38._M_a = 2;
  local_38._M_b = 5;
  local_40._M_a = 3;
  local_40._M_b = 6;
  __urng = &this->generator;
  local_78 = this;
  rVar2 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&local_38,__urng,&local_38);
  (**(code **)(*(long *)model + 0x100))(model,0,rVar2,parent);
  local_108 = __urng;
  rVar2 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&local_40,__urng,&local_40);
  (**(code **)(*(long *)model + 0xf8))(model,0,rVar2,parent);
  pQVar1 = parent->m;
  if (pQVar1 == (QAbstractItemModel *)0x0 || (parent->c | parent->r) < 0) {
    local_128.d.d = (Data *)0x0;
    local_128.d.ptr = (char16_t *)0x0;
    local_128.d.size = 0;
  }
  else {
    (**(code **)(*(long *)pQVar1 + 0x90))(&local_98,pQVar1,parent,2);
    QVariant::toString();
    local_140.d.d = (Data *)0x0;
    local_140.d.ptr = L"->";
    local_140.d.size = 2;
    local_128.d.d = (Data *)local_b0;
    local_128.d.ptr = local_a8;
    local_128.d.size = (qsizetype)pQStack_a0;
    if (local_b0 != (QArrayData *)0x0) {
      LOCK();
      (local_b0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_b0->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::append(&local_128);
    if (&(local_140.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_140.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_140.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_140.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_140.d.d)->super_QArrayData,2,8);
      }
    }
    if (local_b0 != (QArrayData *)0x0) {
      LOCK();
      (local_b0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_b0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_b0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_b0,2,8);
      }
    }
    QVariant::~QVariant(&local_98);
  }
  local_f4 = (int)local_e8 + -1;
  uVar4 = 0;
  local_100 = parent;
  local_f8 = (uint)multiRoles;
  while( true ) {
    iVar3 = (**(code **)(*(long *)model + 0x78))(model,local_100);
    if ((long)iVar3 <= (long)uVar4) break;
    uVar5 = 0;
    while( true ) {
      iVar3 = (**(code **)(*(long *)model + 0x80))(model,local_100);
      if ((long)iVar3 <= (long)uVar5) break;
      (**(code **)(*(long *)model + 0x60))
                ((QModelIndex *)&local_b0,model,uVar4 & 0xffffffff,uVar5 & 0xffffffff,local_100);
      local_e0 = (QArrayData *)0x0;
      local_d8 = L"%1,%2[%3]";
      local_d0 = 9;
      QString::arg((longlong)local_58,(int)&local_e0,(int)uVar4,(QChar)0x0);
      QString::arg((longlong)local_70,(int)local_58,(int)uVar5,(QChar)0x0);
      rVar2 = std::uniform_int_distribution<int>::operator()
                        ((uniform_int_distribution<int> *)&local_f0,local_108,&local_f0);
      QString::arg((longlong)local_c8,(int)local_70,rVar2,(QChar)0x0);
      local_140.d.d = local_128.d.d;
      local_140.d.ptr = local_128.d.ptr;
      local_140.d.size = local_128.d.size;
      if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QString::append(&local_140);
      QVariant::QVariant(&local_98,&local_140);
      (**(code **)(*(long *)model + 0x98))(model,(QModelIndex *)&local_b0,&local_98,2);
      QVariant::~QVariant(&local_98);
      if (&(local_140.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_140.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_140.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_140.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_140.d.d)->super_QArrayData,2,8);
        }
      }
      if (local_c8[0] != (QArrayData *)0x0) {
        LOCK();
        (local_c8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_c8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_c8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_c8[0],2,8);
        }
      }
      if (local_70[0] != (QArrayData *)0x0) {
        LOCK();
        (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_70[0],2,8);
        }
      }
      if (local_58[0] != (QArrayData *)0x0) {
        LOCK();
        (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_58[0],2,8);
        }
      }
      if (local_e0 != (QArrayData *)0x0) {
        LOCK();
        (local_e0->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_e0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_e0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_e0,2,8);
        }
      }
      if (multiRoles) {
        rVar2 = std::uniform_int_distribution<int>::operator()
                          ((uniform_int_distribution<int> *)&local_f0,local_108,&local_f0);
        QVariant::QVariant(&local_98,*(int *)(&DAT_0010be80 + (long)rVar2 * 4));
        (**(code **)(*(long *)model + 0x98))(model,(QModelIndex *)&local_b0,&local_98,8);
        QVariant::~QVariant(&local_98);
        rVar2 = std::uniform_int_distribution<int>::operator()
                          ((uniform_int_distribution<int> *)&local_f0,local_108,&local_f0);
        QVariant::QVariant(&local_98,*(int *)(&DAT_0010be80 + (long)rVar2 * 4));
        (**(code **)(*(long *)model + 0x98))(model,(QModelIndex *)&local_b0,&local_98,9);
        QVariant::~QVariant(&local_98);
        QVariant::QVariant(&local_98,(int)uVar4);
        (**(code **)(*(long *)model + 0x98))(model,(QModelIndex *)&local_b0,&local_98,0x100);
        QVariant::~QVariant(&local_98);
        QVariant::QVariant(&local_98,(int)uVar5);
        (**(code **)(*(long *)model + 0x98))(model,(QModelIndex *)&local_b0,&local_98,0x101);
        QVariant::~QVariant(&local_98);
      }
      if (0 < (int)local_e8) {
        insertBranch(local_78,model,(QModelIndex *)&local_b0,SUB41(local_f8,0),local_f4);
      }
      uVar5 = uVar5 + 1;
    }
    uVar4 = uVar4 + 1;
  }
  if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,8);
    }
  }
  return;
}

Assistant:

void tst_SerialiserCommon::insertBranch(QAbstractItemModel *model, const QModelIndex &parent, bool multiRoles, int subBranches)
{
    Q_ASSERT(model);
    Q_ASSERT(!parent.isValid() || parent.model() == model);
    const int randomBrushes[] = {Qt::red, Qt::blue, Qt::green, Qt::yellow, Qt::magenta, Qt::cyan};
    std::uniform_int_distribution<int> colorDistribution(0, (sizeof(randomBrushes) / sizeof(randomBrushes[0])) - 1);
    std::uniform_int_distribution<int> coulmnsDist(2, 5);
    std::uniform_int_distribution<int> rowsDist(3, 6);
    Q_ASSUME(model->insertColumns(0, coulmnsDist(generator), parent));
    Q_ASSUME(model->insertRows(0, rowsDist(generator), parent));
    const QString baseString = parent.isValid() ? (parent.data(Qt::EditRole).toString() + QStringLiteral("->")) : QString();
    for (int i = 0; i < model->rowCount(parent); ++i) {
        for (int j = 0; j < model->columnCount(parent); ++j) {
            const QModelIndex idx = model->index(i, j, parent);
            model->setData(idx, baseString + QStringLiteral("%1,%2[%3]").arg(i).arg(j).arg(colorDistribution(generator)), Qt::EditRole);
            if (multiRoles) {
                model->setData(idx, randomBrushes[colorDistribution(generator)], Qt::BackgroundRole);
                model->setData(idx, randomBrushes[colorDistribution(generator)], Qt::ForegroundRole);
                model->setData(idx, i, Qt::UserRole);
                model->setData(idx, j, Qt::UserRole + 1);
            }
            if (subBranches > 0)
                insertBranch(model, idx, multiRoles, subBranches - 1);
        }
    }
}